

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

void __thiscall argo::json::json(json *this,json *other)

{
  this->m_type = null_e;
  (this->m_raw_value)._M_dataplus._M_p = (pointer)&(this->m_raw_value).field_2;
  (this->m_raw_value)._M_string_length = 0;
  (this->m_raw_value).field_2._M_local_buf[0] = '\0';
  move_json(this,other);
  return;
}

Assistant:

json::json(json &&other) noexcept : m_type(null_e)
{
    move_json(other);
}